

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superres_scale.c
# Opt level: O0

int av1_superres_in_recode_allowed(AV1_COMP *cpi)

{
  bool local_11;
  AV1EncoderConfig *oxcf;
  AV1_COMP *cpi_local;
  
  local_11 = false;
  if (((cpi->oxcf).superres_cfg.superres_mode == AOM_SUPERRES_AUTO) &&
     (local_11 = false, (cpi->sf).hl_sf.superres_auto_search_type != '\x02')) {
    local_11 = 1 < (cpi->rc).frames_to_key;
  }
  return (int)local_11;
}

Assistant:

int av1_superres_in_recode_allowed(const AV1_COMP *const cpi) {
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  // Empirically found to not be beneficial for image coding.
  return oxcf->superres_cfg.superres_mode == AOM_SUPERRES_AUTO &&
         cpi->sf.hl_sf.superres_auto_search_type != SUPERRES_AUTO_SOLO &&
         cpi->rc.frames_to_key > 1;
}